

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

bool __thiscall
node::anon_unknown_2::ChainImpl::overwriteRwSetting
          (ChainImpl *this,string *name,SettingsValue *value,bool write)

{
  int iVar1;
  long in_FS_OFFSET;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  undefined1 local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_11 = write;
  if (value->typ == VNULL) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      iVar1 = (*(this->super_Chain)._vptr_Chain[0x33])(this,name,(ulong)write);
      return SUB41(iVar1,0);
    }
  }
  else {
    local_38._8_8_ = &local_11;
    local_20 = std::
               _Function_handler<std::optional<interfaces::SettingsAction>_(UniValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp:834:38)>
               ::_M_invoke;
    local_28 = std::
               _Function_handler<std::optional<interfaces::SettingsAction>_(UniValue_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp:834:38)>
               ::_M_manager;
    local_38._M_unused._M_object = value;
    iVar1 = (*(this->super_Chain)._vptr_Chain[0x31])(this,name,&local_38);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
      return SUB41(iVar1,0);
    }
  }
  __stack_chk_fail();
}

Assistant:

bool overwriteRwSetting(const std::string& name, common::SettingsValue& value, bool write) override
    {
        if (value.isNull()) return deleteRwSettings(name, write);
        return updateRwSetting(name, [&](common::SettingsValue& settings) {
            settings = std::move(value);
            return write ? interfaces::SettingsAction::WRITE : interfaces::SettingsAction::SKIP_WRITE;
        });
    }